

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

char * lys_path(lys_node *node)

{
  LY_ERR *pLVar1;
  uint8_t *puVar2;
  uint16_t local_32;
  lys_node *plStack_30;
  uint16_t index;
  char *result;
  char *buf;
  char *buf_backup;
  lys_node *node_local;
  
  buf = (char *)0x0;
  buf_backup = (char *)node;
  result = ly_buf();
  plStack_30 = (lys_node *)0x0;
  local_32 = 0x3ff;
  if (buf_backup == (char *)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    ly_log(LY_LLERR,"%s: NULL node parameter","lys_path");
    node_local = (lys_node *)0x0;
  }
  else {
    puVar2 = ly_buf_used_location();
    if ((*puVar2 != '\0') && (*result != '\0')) {
      buf = strndup(result,0x3ff);
    }
    puVar2 = ly_buf_used_location();
    *puVar2 = *puVar2 + '\x01';
    result[local_32] = '\0';
    ly_vlog_build_path_reverse(LY_VLOG_LYS,buf_backup,result,&local_32,0);
    plStack_30 = (lys_node *)strdup(result + local_32);
    if (buf != (char *)0x0) {
      strcpy(result,buf);
      free(buf);
    }
    puVar2 = ly_buf_used_location();
    *puVar2 = *puVar2 + 0xff;
    node_local = plStack_30;
  }
  return (char *)node_local;
}

Assistant:

API char *
lys_path(const struct lys_node *node)
{
    char *buf_backup = NULL, *buf = ly_buf(), *result = NULL;
    uint16_t index = LY_BUF_SIZE - 1;

    if (!node) {
        LOGERR(LY_EINVAL, "%s: NULL node parameter", __func__);
        return NULL;
    }

    /* backup the shared internal buffer */
    if (ly_buf_used && buf[0]) {
        buf_backup = strndup(buf, LY_BUF_SIZE - 1);
    }
    ly_buf_used++;

    /* build the path */
    buf[index] = '\0';
    ly_vlog_build_path_reverse(LY_VLOG_LYS, node, buf, &index, 0);
    result = strdup(&buf[index]);

    /* restore the shared internal buffer */
    if (buf_backup) {
        strcpy(buf, buf_backup);
        free(buf_backup);
    }
    ly_buf_used--;

    return result;
}